

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<double>_>::PrepareZ
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *y,TPZFMatrix<Fad<double>_> *z,
          Fad<double> *beta,int opt)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  Fad<double> *pFVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  Vector<double> *this_00;
  ulong uVar15;
  long local_88;
  long local_68;
  Fad<double> local_50;
  
  lVar5 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar6 = (y->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar5,lVar6);
  if (0 < lVar6) {
    local_68 = 0;
    local_88 = 0;
    do {
      if (((z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
         ((z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= local_88)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar14 = (z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar7 = z->fElem;
      local_50.val_ = 0.0;
      local_50.dx_.num_elts = 0;
      local_50.dx_.ptr_to_data = (double *)0x0;
      local_50.defaultVal = 0.0;
      dVar1 = beta->val_;
      Fad<double>::~Fad(&local_50);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        if (z != y) {
          memcpy(pFVar7 + lVar14 * local_88,
                 y->fElem + (y->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * local_88,
                 lVar5 << 5);
        }
        if (0 < lVar5) {
          lVar14 = 0;
          do {
            if (((z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar14) ||
               ((z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= local_88)) {
              TPZFMatrix<Fad<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = (z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * local_88;
            pFVar7 = z->fElem + lVar9 + lVar14;
            iVar3 = (beta->dx_).num_elts;
            lVar12 = (long)iVar3;
            uVar4 = z->fElem[lVar9 + lVar14].dx_.num_elts;
            uVar15 = (ulong)uVar4;
            dVar1 = beta->val_;
            if (lVar12 == 0) {
              if ((uVar15 != 0) && (0 < (int)uVar4)) {
                pdVar8 = (pFVar7->dx_).ptr_to_data;
                uVar11 = 0;
                do {
                  pdVar8[uVar11] = pdVar8[uVar11] * dVar1;
                  uVar11 = uVar11 + 1;
                } while (uVar15 != uVar11);
              }
            }
            else {
              pdVar8 = (beta->dx_).ptr_to_data;
              if (uVar15 == 0) {
                (pFVar7->dx_).num_elts = iVar3;
                uVar15 = lVar12 * 8;
                if (iVar3 < 0) {
                  uVar15 = 0xffffffffffffffff;
                }
                pdVar10 = (double *)operator_new__(uVar15);
                (pFVar7->dx_).ptr_to_data = pdVar10;
                if (0 < iVar3) {
                  dVar2 = pFVar7->val_;
                  lVar9 = 0;
                  do {
                    pdVar10[lVar9] = pdVar8[lVar9] * dVar2;
                    lVar9 = lVar9 + 1;
                  } while (lVar12 != lVar9);
                }
              }
              else if (0 < (int)uVar4) {
                pdVar10 = (pFVar7->dx_).ptr_to_data;
                uVar11 = 0;
                do {
                  pdVar10[uVar11] = pFVar7->val_ * pdVar8[uVar11] + pdVar10[uVar11] * dVar1;
                  uVar11 = uVar11 + 1;
                } while (uVar15 != uVar11);
              }
            }
            pFVar7->val_ = dVar1 * pFVar7->val_;
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar5);
        }
      }
      else if (lVar5 != 0) {
        this_00 = (Vector<double> *)((long)&(pFVar7->dx_).num_elts + lVar14 * local_68);
        sVar13 = lVar5 << 5;
        do {
          this_00[-1].ptr_to_data = (double *)0x0;
          if (this_00->num_elts != 0) {
            local_50.val_ = 0.0;
            Vector<double>::operator=(this_00,&local_50.val_);
          }
          this_00 = this_00 + 2;
          sVar13 = sVar13 - 0x20;
        } while (sVar13 != 0);
      }
      local_88 = local_88 + 1;
      local_68 = local_68 + 0x20;
    } while (local_88 != lVar6);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}